

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  long in_RSI;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_58;
  socklen_t local_54;
  timeval tv;
  _sockaddr_in local_40;
  
  iVar5 = (int)ctx + -1;
  iVar7 = 1;
  iVar1 = 0;
  local_58 = 0;
  iVar6 = 0;
  do {
    if ((int)ctx <= iVar7) {
      log_set_level(1);
      if (iVar6 == 0) {
        pcVar3 = "dnsrelay.txt";
      }
      else {
        pcVar3 = *(char **)(in_RSI + (long)iVar6 * 8);
      }
      load_local_record(&cacheset,pcVar3);
      iVar7 = 1000;
      if (iVar1 != 0) {
        iVar7 = iVar1;
      }
      init_A_record_cache(&cacheset.A.temp,iVar7,0x19999999,0.7);
      init_A_record_cache(&cacheset.AAAA.temp,iVar7,0x19999999,0.7);
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x1f8,"init cache done");
      if (local_58 == 0) {
        pcVar3 = "10.3.9.4";
      }
      else {
        pcVar3 = *(char **)(in_RSI + (long)local_58 * 8);
      }
      init_query_server(pcVar3);
      signal(0xd,(__sighandler_t)0x1);
      server_sockfd = socket(2,2,0);
      if (server_sockfd < 0) {
LAB_0010578c:
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        pcVar4 = "socket open error";
        iVar7 = 0x212;
      }
      else {
        log_log(2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                ,0x214,"server accept IPV4 connection only");
        query_sockfd = socket(2,2,0);
        if (query_sockfd < 0) {
          piVar2 = __errno_location();
          pcVar3 = strerror(*piVar2);
          pcVar4 = "socket open error";
          iVar7 = 0x218;
        }
        else {
          tv.tv_sec = 1;
          tv.tv_usec = 0;
          iVar7 = setsockopt(query_sockfd,1,0x14,&tv,0x10);
          if (iVar7 < 0) {
            piVar2 = __errno_location();
            pcVar3 = strerror(*piVar2);
            log_log(4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                    ,0x21f,"set timeout error",pcVar3);
          }
          log_log(2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                  ,0x221,"setting timeout = %d ms",tv.tv_sec * 1000 + tv.tv_usec);
          log_log(2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                  ,0x229,"init all done");
          local_40.sin_zero[0] = '\0';
          local_40.sin_zero[1] = '\0';
          local_40.sin_zero[2] = '\0';
          local_40.sin_zero[3] = '\0';
          local_40.sin_zero[4] = '\0';
          local_40.sin_zero[5] = '\0';
          local_40.sin_zero[6] = '\0';
          local_40.sin_zero[7] = '\0';
          local_40.sin_family = 2;
          local_40.sin_port = 0x3500;
          local_40.sin_addr.s_addr = 0;
          iVar7 = bind(server_sockfd,(sockaddr *)&local_40,0x10);
          if (-1 < iVar7) {
            local_54 = 0x10;
            iVar7 = getsockname(server_sockfd,(sockaddr *)&local_40,&local_54);
            if (iVar7 == -1) {
              perror("getsockname");
            }
            else {
              log_ip("listen on ",&local_40);
            }
            iVar7 = pthread_rwlock_init((pthread_rwlock_t *)&IDAdapter.rwlock,
                                        (pthread_rwlockattr_t *)0x0);
            return iVar7;
          }
          piVar2 = __errno_location();
          pcVar3 = strerror(*piVar2);
          pcVar4 = "bind error";
          iVar7 = 0x19d;
        }
      }
      log_log(5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,iVar7,"%s:%s",pcVar4,pcVar3);
      exit(1);
    }
    pcVar3 = *(char **)(in_RSI + (long)iVar7 * 8);
    if (*pcVar3 != '-') {
LAB_00105787:
      dnsExit();
      goto LAB_0010578c;
    }
    if ((pcVar3[1] == 'd') && (pcVar3[2] == '\0')) {
      if (iVar7 == iVar5) goto LAB_00105787;
    }
    else if ((pcVar3[1] == 'f') && (pcVar3[2] == '\0')) {
      if (iVar7 == iVar5) goto LAB_00105787;
      iVar6 = iVar7 + 1;
    }
    else if ((pcVar3[1] == 's') && (pcVar3[2] == '\0')) {
      if (iVar7 == iVar5) goto LAB_00105787;
      local_58 = iVar7 + 1;
    }
    else {
      if ((pcVar3[1] != 'c') || ((pcVar3[2] != '\0' || (iVar7 == iVar5)))) goto LAB_00105787;
      iVar1 = atoi(*(char **)(in_RSI + 8 + (long)iVar7 * 8));
    }
    iVar7 = iVar7 + 2;
  } while( true );
}

Assistant:

void init(int argc,char **argv) {
  int debug_lev=0,cache_num=0,dns_server=0,file=0;
  for(int i=1;i<argc;i++){
    if(!strcmp(argv[i],"-d")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        debug_lev=++i;
      }
    }
    else if(!strcmp(argv[i],"-f")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        file=++i;
      }
    }
    else if(!strcmp(argv[i],"-s")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        dns_server=++i;
      }
    }
    else if(!strcmp(argv[i],"-c")){
      if(i==argc-1){
        dnsExit();
      }
      else{
        cache_num=atoi(argv[++i]);
      }
    }
    else{
        dnsExit();
    }
  }
  log_set_level(LOG_DEBUG);
  // log_set_level(debug_lev!=0?atoi(argv[debug_lev]):2);
  load_local_record(&cacheset,file==0?"dnsrelay.txt":argv[file]);
  init_A_record_cache(&cacheset.A.temp,cache_num?cache_num:LRU_BUFFER_LENGTH,CACHE_INFINTE_SIZE,CACHE_FILLING_FACTOR);
  init_A_record_cache(&cacheset.AAAA.temp,cache_num?cache_num:LRU_BUFFER_LENGTH,CACHE_INFINTE_SIZE,CACHE_FILLING_FACTOR);
  log_info("init cache done");

  init_query_server(dns_server==0?"10.3.9.4":argv[dns_server]);
  #ifdef _WIN64
    WSADATA wsaData;
    if(WSAStartup(MAKEWORD(2,2),&wsaData)!=0){//协商版本winsock 2.2
      log_fatal_exit_shortcut("winsock init error");
    }
    system("chcp 65001");//修改控制台格式为65001
  #endif
  #ifdef __linux
    signal(SIGPIPE, SIG_IGN);
    //忽略管道破裂
  #endif
  // signal(SIGINT,handle_)
  #ifdef ACCEPT_IPV6_REQUEST
  int no = 0;  
  if( (server_sockfd = socket(PF_INET6, SOCK_DGRAM, 0))<0){
    log_fatal_exit_shortcut("socket open error");
  }
  if (setsockopt(server_sockfd, IPPROTO_IPV6, IPV6_V6ONLY, (void *)&no, sizeof(no))<0){
    log_fatal_shortcut("failed set ipv6 only off:");
  }
  log_info("server accept IPV6 and IPV4 connection");
  #else
  if( (server_sockfd = socket(AF_INET, SOCK_DGRAM, 0))<0){
      log_fatal_exit_shortcut("socket open error");
  }
  log_info("server accept IPV4 connection only");
  #endif

  if( (query_sockfd = socket(AF_INET, SOCK_DGRAM, 0))<0){
      log_fatal_exit_shortcut("socket open error");
  }
  #ifdef __linux
  struct timeval tv;
  tv.tv_sec = 1;
  tv.tv_usec = 0;
  if (setsockopt(query_sockfd, SOL_SOCKET, SO_RCVTIMEO,&tv,sizeof(tv)) < 0) {
      log_error("set timeout error",strerror(errno));
  }
  log_info("setting timeout = %d ms",tv.tv_sec * 1000 + tv.tv_usec);
  #elif defined(_WIN64)
  DWORD timeout = 1 * 1000;//设置超时时间
  if(setsockopt(query_sockfd, SOL_SOCKET, SO_RCVTIMEO, (const char*)&timeout, sizeof timeout)<0){
      log_error_shortcut("set timeout error");
  }
  log_info("setting timeout = %d ms",timeout);
  #endif
  log_info("init all done");
  bind_addr();
  pthread_rwlock_init(&IDAdapter.rwlock, NULL);
}